

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O0

err_t dstuPointGen(octet *point,dstu_params *params,gen_i rng,void *rng_state)

{
  bool_t bVar1;
  word *a;
  size_t pos;
  undefined8 in_RCX;
  code *in_RDX;
  void *in_RDI;
  void *stack;
  word *t;
  word *y;
  word *x;
  ec_o *ec;
  ec_o **in_stack_00000038;
  err_t code;
  word *in_stack_ffffffffffffff98;
  u64 *in_stack_ffffffffffffffa0;
  size_t *stack_00;
  qr_o *f;
  ec_o *ec_00;
  word *x_00;
  err_t local_4;
  
  x_00 = (word *)0x0;
  if (in_RDX == (code *)0x0) {
    local_4 = 0x130;
  }
  else {
    local_4 = dstuEcCreate(in_stack_00000038,(dstu_params *)ec,(dstu_deep_i)x);
    if (local_4 == 0) {
      bVar1 = memIsValid(in_RDI,*(long *)(x_00[3] + 0x38) << 1);
      if (bVar1 == 0) {
        dstuEcClose((ec_o *)0x16453d);
        local_4 = 0x6d;
      }
      else {
        a = (word *)((long)x_00 + *x_00);
        ec_00 = (ec_o *)(a + *(long *)(x_00[3] + 0x30));
        f = (qr_o *)(&(ec_00->hdr).keep + *(long *)(x_00[3] + 0x30));
        stack_00 = &(f->hdr).keep + *(long *)(x_00[3] + 0x30);
        do {
          (*in_RDX)(a,*(undefined8 *)(x_00[3] + 0x38),in_RCX);
          u64From(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0x1645f0);
          in_stack_ffffffffffffff98 = a;
          in_stack_ffffffffffffffa0 = *(u64 **)(x_00[3] + 0x30);
          a = in_stack_ffffffffffffff98;
          pos = gf2Deg((qr_o *)x_00[3]);
          wwTrimHi(in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffffa0,pos);
          (**(code **)(x_00[3] + 0x70))(ec_00,a,x_00[3],stack_00);
          (**(code **)(x_00[3] + 0x68))(f,a,ec_00,x_00[3],stack_00);
          bVar1 = wwIsZero((word *)x_00[4],*(size_t *)(x_00[3] + 0x30));
          if (bVar1 == 0) {
            wwXor2((word *)f,(word *)ec_00,*(size_t *)(x_00[3] + 0x30));
          }
          wwXor2((word *)f,(word *)x_00[5],*(size_t *)(x_00[3] + 0x30));
          bVar1 = gf2QSolve(x_00,a,(word *)ec_00,f,stack_00);
        } while ((bVar1 == 0) ||
                (bVar1 = ecHasOrderA(a,ec_00,(word *)f,(size_t)stack_00,in_stack_ffffffffffffffa0),
                bVar1 == 0));
        (**(code **)(x_00[3] + 0x48))(in_RDI,a,x_00[3],stack_00);
        (**(code **)(x_00[3] + 0x48))
                  ((long)in_RDI + *(long *)(x_00[3] + 0x38),ec_00,x_00[3],stack_00);
        dstuEcClose((ec_o *)0x16479b);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

err_t dstuPointGen(octet point[], const dstu_params* params, gen_i rng, 
	void* rng_state)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	word* x;
	word* y;
	word* t;
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuPointGen_deep);
	ERR_CALL_CHECK(code);
	// проверить входные указатели
	if (!memIsValid(point, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	x = objEnd(ec, word);
	y = x + ec->f->n;
	t = y + ec->f->n;
	stack = t + ec->f->n;
	// пока точка не сгенерирована
	while (1)
	{
		// сгенерировать x-координату
		// [алгоритм из раздела 6.4 ДСТУ --- обрезка x]
		rng(x, ec->f->no, rng_state);
		wwFrom(x, x, ec->f->no);
		wwTrimHi(x, ec->f->n, gf2Deg(ec->f));
		// y <- x^2
		qrSqr(y, x, ec->f, stack);
		// t <- x^3
		qrMul(t, x, y, ec->f, stack);
		// t <- x^3 + a x^2 + b
		if (!qrIsZero(ec->A, ec->f))
			gf2Add2(t, y, ec->f);
		gf2Add2(t, ec->B, ec->f);
		// y <- Solve[y^2 + x y == t], ord(x, y) == order?
		if (gf2QSolve(y, x, t, ec->f, stack) &&
			ecHasOrderA(x, ec, ec->order, ec->f->n, stack))
			break;
	}
	// выгрузить точку
	qrTo(point, x, ec->f, stack);
	qrTo(point + ec->f->no, y, ec->f, stack);
	// завершение
	dstuEcClose(ec);
	return ERR_OK;
}